

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_memorydata_binaryop(NetOptimize *this)

{
  pointer *ppiVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  int *piVar6;
  pointer ppLVar7;
  Layer *pLVar8;
  Layer *pLVar9;
  long lVar10;
  pointer piVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  pointer piVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  
  pvVar2 = (this->super_ModelWriter).layers;
  ppLVar3 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar4 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar21 = (long)ppLVar4 - (long)ppLVar3 >> 3;
  if (ppLVar4 != ppLVar3) {
    lVar22 = 0;
    do {
      iVar13 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar22]->type);
      if (iVar13 == 0) {
        iVar13 = *((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar22]->tops).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        uVar16 = lVar22 + 1;
        uVar17 = uVar16;
        while ((uVar16 < uVar21 &&
               (((iVar14 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                               type), iVar14 != 0 ||
                 (pLVar5 = (((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar16],
                 piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                 (long)*(pointer *)
                        ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - (long)piVar6 != 8)) ||
                ((uVar17 = uVar16, *piVar6 != iVar13 && (piVar6[1] != iVar13))))))) {
          uVar16 = uVar16 + 1;
          uVar17 = uVar21;
        }
        if (uVar17 != uVar21) {
          ppLVar7 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar5 = ppLVar7[lVar22];
          if (((*(int *)&pLVar5[1]._vptr_Layer == 1) &&
              (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) &&
             (iVar14._0_1_ = pLVar5[1].one_blob_only, iVar14._1_1_ = pLVar5[1].support_inplace,
             iVar14._2_1_ = pLVar5[1].support_vulkan, iVar14._3_1_ = pLVar5[1].support_packing,
             iVar14 == 0)) {
            pLVar5 = ppLVar7[uVar17];
            if (*(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start == iVar13) {
              uVar18 = *(uint *)&pLVar5[1]._vptr_Layer;
              if (uVar18 < 6) {
                if ((0x35U >> (uVar18 & 0x1f) & 1) == 0) {
                  uVar15 = 7;
                  if (uVar18 != 1) {
                    uVar15 = 8;
                  }
                  *(undefined4 *)&pLVar5[1]._vptr_Layer = uVar15;
                }
                bVar12 = true;
              }
              else {
                bVar12 = false;
              }
              if (!bVar12) goto LAB_0014afc8;
            }
            fuse_memorydata_binaryop();
          }
        }
      }
LAB_0014afc8:
      lVar22 = lVar22 + 1;
    } while (lVar22 != uVar21 + (uVar21 == 0));
  }
  if (ppLVar4 != ppLVar3) {
    uVar16 = 0;
    do {
      iVar13 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
      if (iVar13 == 0) {
        uVar17 = uVar16 + 1;
        uVar24 = uVar16;
        if (uVar17 < uVar21) {
          iVar13 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar16]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          uVar20 = uVar17;
          do {
            uVar24 = uVar20;
            iVar14 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar24]->type);
            if (((iVar14 == 0) &&
                (pLVar5 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar24],
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar6 == 4)) && (*piVar6 == iVar13)) {
              uVar17 = uVar24;
              uVar24 = uVar24 - 1;
              break;
            }
            uVar20 = uVar24 + 1;
            uVar17 = uVar21;
          } while (uVar21 != uVar24 + 1);
        }
        if (uVar17 != uVar21) {
          uVar24 = uVar24 + 2;
          lVar22 = -1;
          if (uVar24 < uVar21) {
            do {
              iVar13 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar24]->type)
              ;
              if (iVar13 == 0) {
                ppLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                pLVar5 = ppLVar3[uVar24];
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((long)*(pointer *)
                           ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) - (long)piVar6 == 8) {
                  pLVar5 = ppLVar3[uVar17];
                  lVar22 = *(long *)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data;
                  iVar13 = -1;
                  uVar18 = (uint)((ulong)((long)*(pointer *)
                                                 ((long)&(pLVar5->tops).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - lVar22) >> 2);
                  if (0 < (int)uVar18) {
                    uVar20 = 0;
                    do {
                      iVar14 = *(int *)(lVar22 + uVar20 * 4);
                      if ((*piVar6 == iVar14) || (piVar6[1] == iVar14)) {
                        iVar13 = (int)uVar20;
                        break;
                      }
                      uVar20 = uVar20 + 1;
                    } while ((uVar18 & 0x7fffffff) != uVar20);
                  }
                  if (iVar13 != -1) goto LAB_0014b161;
                }
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar21);
            iVar13 = -1;
            uVar24 = uVar21;
LAB_0014b161:
            lVar22 = (long)iVar13;
          }
          if (uVar24 != uVar21) {
            ppLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar5 = ppLVar3[uVar16];
            if (((*(int *)&pLVar5[1]._vptr_Layer == 1) &&
                (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) &&
               (iVar13._0_1_ = pLVar5[1].one_blob_only, iVar13._1_1_ = pLVar5[1].support_inplace,
               iVar13._2_1_ = pLVar5[1].support_vulkan, iVar13._3_1_ = pLVar5[1].support_packing,
               iVar13 == 0)) {
              pLVar8 = ppLVar3[uVar17];
              pLVar9 = ppLVar3[uVar24];
              if (*(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                  *(int *)(*(long *)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + lVar22 * 4)) {
                uVar18 = *(uint *)&pLVar9[1]._vptr_Layer;
                if (uVar18 < 6) {
                  if ((0x35U >> (uVar18 & 0x1f) & 1) == 0) {
                    uVar15 = 7;
                    if (uVar18 != 1) {
                      uVar15 = 8;
                    }
                    *(undefined4 *)&pLVar9[1]._vptr_Layer = uVar15;
                  }
                  bVar12 = true;
                  lVar23 = 0;
                }
                else {
                  lVar23 = 1;
                  bVar12 = false;
                }
                if (!bVar12) goto LAB_0014b1e5;
              }
              else {
                lVar23 = 1;
              }
              uVar15 = **(undefined4 **)&pLVar5[1].support_tensor_storage;
              *(undefined4 *)((long)&pLVar9[1]._vptr_Layer + 4) = 1;
              pLVar9[1].one_blob_only = (bool)(char)uVar15;
              pLVar9[1].support_inplace = (bool)(char)((uint)uVar15 >> 8);
              pLVar9[1].support_vulkan = (bool)(char)((uint)uVar15 >> 0x10);
              pLVar9[1].support_packing = (bool)(char)((uint)uVar15 >> 0x18);
              fprintf(_stderr,"fuse_memorydata_binaryop %s %s\n",(pLVar5->name)._M_dataplus._M_p,
                      (pLVar9->name)._M_dataplus._M_p);
              lVar10 = *(long *)&(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data;
              piVar11 = *(pointer *)
                         ((long)&(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8);
              piVar19 = (pointer)(lVar10 + lVar23 * 4 + 4);
              if (piVar19 != piVar11) {
                memmove((void *)(lVar10 + lVar23 * 4),piVar19,(long)piVar11 - (long)piVar19);
              }
              ppiVar1 = (pointer *)
                        ((long)&(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8);
              *ppiVar1 = *ppiVar1 + -1;
              lVar23 = *(long *)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data;
              piVar11 = *(pointer *)
                         ((long)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8);
              piVar19 = (pointer)(lVar23 + lVar22 * 4 + 4);
              if (piVar19 != piVar11) {
                memmove((void *)(lVar23 + lVar22 * 4),piVar19,(long)piVar11 - (long)piVar19);
              }
              piVar11 = (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar19 = *(pointer *)
                         ((long)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) + -1;
              *(pointer *)
               ((long)&(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                   piVar19;
              if (piVar11 == piVar19) {
                std::__cxx11::string::operator=((string *)&pLVar8->type,"ncnnfused");
                std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
              }
              uVar16 = uVar16 - 1;
            }
          }
        }
      }
LAB_0014b1e5:
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar21);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_memorydata_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse MemoryData - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == top_blob_index)
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        memorydata->type = "ncnnfused";
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - Split - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j0 = i + 1;
        for (; j0 < layer_count; j0++)
        {
            if (layers[j0]->type != "Split")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (layers[j0]->bottoms[0] == top_blob_index)
                break;
        }

        if (j0 == layer_count)
            continue;

        int split_top_blob_index = -1;

        size_t j1 = j0 + 1;
        for (; j1 < layer_count; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 2)
                continue;

            for (int k = 0; k < (int)layers[j0]->tops.size(); k++)
            {
                if (layers[j1]->bottoms[0] == layers[j0]->tops[k] || layers[j1]->bottoms[1] == layers[j0]->tops[k])
                {
                    split_top_blob_index = k;
                    break;
                }
            }

            if (split_top_blob_index != -1)
                break;
        }

        if (j1 == layer_count)
            continue;

        // fuse MemoryData - Split - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::Split* split = (ncnn::Split*)layers[j0];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j1];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == split->tops[split_top_blob_index])
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        split->tops.erase(split->tops.begin() + split_top_blob_index);
        if (split->tops.empty())
        {
            split->type = "ncnnfused";
            memorydata->type = "ncnnfused";
        }

        i--;
    }

    return 0;
}